

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlCtxtErrIO(xmlParserCtxtPtr ctxt,int code,char *uri)

{
  xmlErrorLevel local_4c;
  char *pcStack_48;
  xmlErrorLevel level;
  char *str2;
  char *str1;
  char *msg;
  char *errstr;
  char *uri_local;
  int code_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if ((code == 0x5f4) || (code == 0x5dc)) {
      if (ctxt->validate == 0) {
        local_4c = XML_ERR_WARNING;
      }
      else {
        local_4c = XML_ERR_ERROR;
      }
    }
    else if (code == 0x607) {
      local_4c = XML_ERR_ERROR;
    }
    else {
      local_4c = XML_ERR_FATAL;
    }
    str2 = xmlErrString(code);
    if (uri == (char *)0x0) {
      str1 = "%s\n";
      pcStack_48 = (char *)0x0;
    }
    else {
      str1 = "failed to load \"%s\": %s\n";
      pcStack_48 = str2;
      str2 = uri;
    }
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_IO,code,local_4c,(xmlChar *)uri,(xmlChar *)0x0,
               (xmlChar *)0x0,0,str1,str2,pcStack_48);
  }
  return;
}

Assistant:

void
xmlCtxtErrIO(xmlParserCtxtPtr ctxt, int code, const char *uri)
{
    const char *errstr, *msg, *str1, *str2;
    xmlErrorLevel level;

    if (ctxt == NULL)
        return;

    if (((code == XML_IO_ENOENT) ||
         (code == XML_IO_UNKNOWN))) {
        /*
         * Only report a warning if a file could not be found. This should
         * only be done for external entities, but the external entity loader
         * of xsltproc can try multiple paths and assumes that ENOENT doesn't
         * raise an error and aborts parsing.
         */
        if (ctxt->validate == 0)
            level = XML_ERR_WARNING;
        else
            level = XML_ERR_ERROR;
    } else if (code == XML_IO_NETWORK_ATTEMPT) {
        level = XML_ERR_ERROR;
    } else {
        level = XML_ERR_FATAL;
    }

    errstr = xmlErrString(code);

    if (uri == NULL) {
        msg = "%s\n";
        str1 = errstr;
        str2 = NULL;
    } else {
        msg = "failed to load \"%s\": %s\n";
        str1 = uri;
        str2 = errstr;
    }

    xmlCtxtErr(ctxt, NULL, XML_FROM_IO, code, level,
               (const xmlChar *) uri, NULL, NULL, 0,
               msg, str1, str2);
}